

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

int __thiscall
capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
          (PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *this,EVP_PKEY_CTX *ctx)

{
  StructBuilder builder;
  bool bVar1;
  StructSize size;
  StructBuilder local_c0;
  Schema local_98;
  Fault local_80;
  Fault f;
  Reader local_48;
  bool local_12;
  DebugExpression<bool> local_11;
  Schema SStack_10;
  DebugExpression<bool> _kjCondition;
  StructSchema schema_local;
  
  SStack_10.raw = (RawBrandedSchema *)ctx;
  Schema::getProto((Reader *)&f,&stack0xfffffffffffffff0);
  capnp::schema::Node::Reader::getStruct(&local_48,(Reader *)&f);
  bVar1 = capnp::schema::Node::Struct::Reader::getIsGroup(&local_48);
  local_12 = (bool)((bVar1 ^ 0xffU) & 1);
  local_11 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_12);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_11);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[35]>
              (&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x783,FAILED,"!schema.getProto().getStruct().getIsGroup()",
               "_kjCondition,\"Cannot form pointer to group type.\"",&local_11,
               (char (*) [35])"Cannot form pointer to group type.");
    kj::_::Debug::Fault::fatal(&local_80);
  }
  local_98.raw = SStack_10.raw;
  size = anon_unknown_70::structSizeFromSchema((StructSchema)SStack_10.raw);
  PointerBuilder::initStruct(&local_c0,(PointerBuilder *)&stack0x00000008,size);
  builder.capTable = local_c0.capTable;
  builder.segment = local_c0.segment;
  builder.data = local_c0.data;
  builder.pointers = local_c0.pointers;
  builder.dataSize = local_c0.dataSize;
  builder.pointerCount = local_c0.pointerCount;
  builder._38_2_ = local_c0._38_2_;
  DynamicStruct::Builder::Builder((Builder *)this,(StructSchema)local_98.raw,builder);
  return (int)this;
}

Assistant:

DynamicStruct::Builder PointerHelpers<DynamicStruct, Kind::OTHER>::init(
    PointerBuilder builder, StructSchema schema) {
  KJ_REQUIRE(!schema.getProto().getStruct().getIsGroup(),
             "Cannot form pointer to group type.");
  return DynamicStruct::Builder(schema,
      builder.initStruct(structSizeFromSchema(schema)));
}